

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O0

void inlet_list(_inlet *x,t_symbol *s,int argc,t_atom *argv)

{
  t_pd *x_00;
  t_symbol *ptVar1;
  t_gotfn p_Var2;
  char *pcVar3;
  t_float f;
  t_atom at;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  _inlet *x_local;
  
  if ((((x->i_symfrom == &s_list) || (x->i_symfrom == &s_float)) || (x->i_symfrom == &s_symbol)) ||
     (x->i_symfrom == &s_pointer)) {
    pd_typedmess(x->i_dest,(x->i_un).iu_symto,argc,argv);
  }
  else if (x->i_symfrom == (t_symbol *)0x0) {
    pd_list(x->i_dest,s,argc,argv);
  }
  else if (argc == 0) {
    inlet_bang(x);
  }
  else if ((argc == 1) && (argv->a_type == A_FLOAT)) {
    f = atom_getfloat(argv);
    inlet_float(x,f);
  }
  else if ((argc == 1) && (argv->a_type == A_SYMBOL)) {
    ptVar1 = atom_getsymbol(argv);
    inlet_symbol(x,ptVar1);
  }
  else {
    if (x->i_symfrom == &s_signal) {
      x_00 = x->i_dest;
      ptVar1 = gensym("fwd");
      p_Var2 = zgetfn(x_00,ptVar1);
      if (p_Var2 != (t_gotfn)0x0) {
        inlet_fwd(x,&s_list,argc,argv);
        return;
      }
    }
    pcVar3 = class_getname(*x->i_dest);
    post("class %s",pcVar3);
    inlet_wrong(x,&s_list);
  }
  return;
}

Assistant:

static void inlet_list(t_inlet *x, t_symbol *s, int argc, t_atom *argv)
{
    t_atom at;
    if (x->i_symfrom == &s_list || x->i_symfrom == &s_float
        || x->i_symfrom == &s_symbol || x->i_symfrom == &s_pointer)
            typedmess(x->i_dest, x->i_symto, argc, argv);
    else if (!x->i_symfrom) pd_list(x->i_dest, s, argc, argv);
    else if (!argc)
      inlet_bang(x);
    else if (argc==1 && argv->a_type == A_FLOAT)
      inlet_float(x, atom_getfloat(argv));
    else if (argc==1 && argv->a_type == A_SYMBOL)
      inlet_symbol(x, atom_getsymbol(argv));
    else if (x->i_symfrom == &s_signal && zgetfn(x->i_dest, gensym("fwd")))
        inlet_fwd(x, &s_list, argc, argv);
    else post("class %s", class_getname(*x->i_dest)), inlet_wrong(x, &s_list);
}